

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void ClownLZSS::Internal::
     ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,512u,512u,_1>>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_512U,_512U,__1>
               *output,_func_void_DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_ptr_DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_512U,_512U,__1>_ptr
                       *decompression_function,size_t module_alignment)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 1;
  uVar5 = 0;
  do {
    bVar1 = std::istream::get();
    uVar5 = (ulong)bVar1 | uVar5 << 8;
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  lVar2 = std::istream::tellg();
  uVar5 = uVar5 + 0xfff >> 0xc;
  while (uVar5 = uVar5 - 1, uVar5 != 0) {
    (*decompression_function)(input,output);
    lVar3 = std::istream::tellg();
    std::istream::seekg((long)(input->
                              super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ).input,
                        (_Ios_Seekdir)
                        ((module_alignment - (ulong)(lVar3 - lVar2) % module_alignment) %
                        module_alignment));
  }
  (*decompression_function)(input,output);
  return;
}

Assistant:

void ModuledDecompressionWrapper(DecompressorInput<T1> &input, T2 &output, void (* const decompression_function)(DecompressorInput<T1> &input, T2 &output), const std::size_t module_alignment)
		{
			const auto header = input.template Read<total_bytes, endian>();

			const auto input_start_position = input.Tell();

			const unsigned long total_modules = (header + (0x1000 - 1)) / 0x1000; // Round up.

			for (unsigned long i = 0; i < total_modules - 1; ++i)
			{
				decompression_function(input, output);
				input += (module_alignment - (input.Distance(input_start_position) % module_alignment)) % module_alignment;
				output.Reset();
			}

			decompression_function(input, output);
		}